

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O3

void __thiscall bwtil::IndexedBWT::sampleSA(IndexedBWT *this,bool verbose)

{
  ulong uVar1;
  size_t sVar2;
  unsigned_long uVar3;
  byte c;
  ostream *poVar4;
  ulint uVar5;
  long lVar6;
  uint64_t uVar7;
  int iVar8;
  undefined7 in_register_00000031;
  long lVar9;
  int iVar10;
  ulong i;
  word_type value;
  
  uVar5 = this->n;
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
  value = uVar5 - 1;
  if (value == 0) {
    i = 0;
  }
  else {
    iVar8 = 1;
    i = 0;
    lVar9 = 1 - uVar5;
    do {
      iVar10 = (int)(((lVar9 + this->n) * 100) / this->n);
      if ((iVar8 != iVar10 && verbose) &&
          ((uint)(iVar10 * -0x33333333) >> 1 | iVar10 * -0x80000000) < 0x1999999a) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% done.\n",8);
        iVar8 = iVar10;
      }
      uVar1 = (this->marked_positions).bitvector.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[i >> 6];
      if ((uVar1 >> ((ulong)(byte)~(byte)i & 0x3f) & 1) != 0) {
        if ((this->marked_positions).n == i) {
          uVar7 = (this->marked_positions).global_rank1;
        }
        else {
          lVar6 = POPCOUNT(uVar1 >> ((ulong)(byte)-((byte)i & 0x3f) & 0x3f));
          if ((i & 0x3f) == 0) {
            lVar6 = 0;
          }
          uVar7 = lVar6 + (this->marked_positions).rank_ptrs_1.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[i >> 0xc] +
                  (ulong)(this->marked_positions).rank_ptrs_2.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[i >> 6];
        }
        sVar2 = (this->text_pointers)._width;
        bv::internal::bitview<std::vector>::set
                  (&(this->text_pointers)._bits,sVar2 * uVar7,(uVar7 + 1) * sVar2,value);
      }
      c = charAt_remapped(this,i);
      uVar3 = (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[c];
      uVar5 = rank(this,c,i);
      i = uVar5 + uVar3;
      value = value - 1;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0);
  }
  if ((this->marked_positions).n == i) {
    uVar7 = (this->marked_positions).global_rank1;
  }
  else {
    if ((i & 0x3f) == 0) {
      lVar9 = 0;
    }
    else {
      lVar9 = POPCOUNT((this->marked_positions).bitvector.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[i >> 6] >>
                       ((ulong)(byte)-((byte)i & 0x3f) & 0x3f));
    }
    uVar7 = lVar9 + (this->marked_positions).rank_ptrs_1.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[i >> 0xc] +
            (ulong)(this->marked_positions).rank_ptrs_2.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start[i >> 6];
  }
  sVar2 = (this->text_pointers)._width;
  bv::internal::bitview<std::vector>::set
            (&(this->text_pointers)._bits,sVar2 * uVar7,(uVar7 + 1) * sVar2,0);
  return;
}

Assistant:

void sampleSA(bool verbose){//sample Suffix Array pointers (1 every offrate positions on text). Vector marked_positions must be already computed!

		ulint i=n-1;//current position on text
		ulint j=0;  //current position on the BWT (0=terminator position on the F column)
		uint perc;
		uint last_perc=1;

		if(verbose) cout << endl;

		while(i>0){

			perc = (100*(n-i))/n;

			if(verbose)
				if(perc%10==0 and perc!= last_perc){

					cout << "   " << perc << "% done.\n";
					last_perc=perc;

				}

			if(marked_positions.at(j)==1)
				text_pointers[marked_positions.rank1(j)] = i;

			j = LF(j);
			i--;

		}

		//i=0
		text_pointers[marked_positions.rank1(j)] = 0;

	}